

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracer-real-time.cpp
# Opt level: O2

void __thiscall dynamicgraph::TracerRealTime::trace(TracerRealTime *this)

{
  ostream *os;
  OutStringStream *this_00;
  ExceptionTraces *pEVar1;
  _List_node_base *p_Var2;
  long *plVar3;
  allocator<char> local_55;
  ErrorCodeEnum local_54;
  string local_50 [32];
  
  p_Var2 = (_List_node_base *)&this->hardFiles;
  plVar3 = (long *)&this->field_0x190;
  while( true ) {
    plVar3 = (long *)*plVar3;
    if ((long *)&this->field_0x190 == plVar3) {
      return;
    }
    if (plVar3[2] == 0) {
      pEVar1 = (ExceptionTraces *)__cxa_allocate_exception(0x30);
      local_54 = NOT_OPEN;
      std::__cxx11::string::string<std::allocator<char>>(local_50,"The buffer is null",&local_55);
      dynamicgraph::ExceptionTraces::ExceptionTraces(pEVar1,&local_54,local_50,"");
      __cxa_throw(pEVar1,&ExceptionTraces::typeinfo,ExceptionAbstract::~ExceptionAbstract);
    }
    p_Var2 = (((_List_base<std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_*>_>
                *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    this_00 = (OutStringStream *)
              __dynamic_cast(plVar3[2],&std::ostream::typeinfo,&OutStringStream::typeinfo,0);
    if (this_00 == (OutStringStream *)0x0) {
      pEVar1 = (ExceptionTraces *)__cxa_allocate_exception(0x30);
      local_54 = NOT_OPEN;
      std::__cxx11::string::string<std::allocator<char>>
                (local_50,"The buffer is not open",&local_55);
      dynamicgraph::ExceptionTraces::ExceptionTraces(pEVar1,&local_54,local_50,"");
      __cxa_throw(pEVar1,&ExceptionTraces::typeinfo,ExceptionAbstract::~ExceptionAbstract);
    }
    os = (ostream *)p_Var2[1]._M_next;
    if (*(int *)(&os->field_0x20 + (long)os->_vptr_basic_ostream[-3]) != 0) break;
    OutStringStream::dump(this_00,os);
    *(undefined8 *)
     &(this_00->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x78 =
         0;
    (this_00->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x88 = 0
    ;
    std::ostream::flush();
  }
  pEVar1 = (ExceptionTraces *)__cxa_allocate_exception(0x30);
  local_54 = NOT_OPEN;
  std::__cxx11::string::string<std::allocator<char>>(local_50,"The file is not open",&local_55);
  dynamicgraph::ExceptionTraces::ExceptionTraces(pEVar1,&local_54,local_50,"");
  __cxa_throw(pEVar1,&ExceptionTraces::typeinfo,ExceptionAbstract::~ExceptionAbstract);
}

Assistant:

void TracerRealTime::trace() {
  dgDEBUGIN(15);

  FileList::iterator iter = files.begin();
  HardFileList::iterator hardIter = hardFiles.begin();

  while (files.end() != iter) {
    dgDEBUG(35) << "Next" << endl;
    std::ostream *os = *iter;
    if (NULL == os) {
      DG_THROW ExceptionTraces(ExceptionTraces::NOT_OPEN, "The buffer is null",
                               "");
    }
    // std::stringstream & file = * dynamic_cast< stringstream* >(os);
    OutStringStream *file = dynamic_cast<OutStringStream *>(os);  // segfault
    if (NULL == file) {
      DG_THROW ExceptionTraces(ExceptionTraces::NOT_OPEN,
                               "The buffer is not open", "");
    }

    std::ofstream &hardFile = **hardIter;
    if (!hardFile.good()) {
      DG_THROW ExceptionTraces(ExceptionTraces::NOT_OPEN,
                               "The file is not open", "");
    }

    if ((hardFile.good()) && (NULL != file)) {
      file->dump(hardFile);
      file->empty();
      hardFile.flush();
    }

    ++iter;
    ++hardIter;
  }

  dgDEBUGOUT(15);
}